

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O1

void __thiscall
cppnet::BaseLogger::BaseLogger(BaseLogger *this,uint16_t cache_size,uint16_t block_size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  this->_level = 0xf;
  this->_cache_size = cache_size;
  this->_block_size = block_size;
  memset(&this->_allocter,0,0x88);
  std::_Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>::_M_initialize_map
            ((_Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_> *)
             &(this->_cache_queue)._queue,0);
  (this->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  MakeNormalAlloterPtr();
  this_00 = (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Stack_20;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

BaseLogger::BaseLogger(uint16_t cache_size, uint16_t block_size):
    _level(LL_INFO),
    _cache_size(cache_size),
    _block_size(block_size) {

    _allocter = MakeNormalAlloterPtr();
}